

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O2

void wipe_mon_list(chunk *c,player *p)

{
  object *obj_00;
  loc grid;
  _Bool _Var1;
  wchar_t idx;
  monster *__s;
  monster_race *pmVar2;
  angband_constants *paVar3;
  chunk *p_c;
  ulong uVar4;
  object *obj;
  object *obj_01;
  
  idx = cave_monster_max((chunk_conflict *)c);
  while (L'\x01' < idx) {
    idx = idx + L'\xffffffff';
    __s = cave_monster((chunk_conflict *)c,idx);
    if ((__s != (monster *)0x0) && (__s->race != (monster_race *)0x0)) {
      obj_00 = __s->held_obj;
      obj_01 = obj_00;
      if (obj_00 != (object *)0x0) {
        for (; obj_01 != (object *)0x0; obj_01 = obj_01->next) {
          if ((obj_01->artifact != (artifact *)0x0) &&
             (_Var1 = obj_is_known_artifact(obj_01), !_Var1)) {
            mark_artifact_created(obj_01->artifact,false);
          }
          if ((ulong)obj_01->oidx != 0) {
            c->objects[obj_01->oidx] = (object *)0x0;
          }
        }
        if (p == (player *)0x0) {
          p_c = (chunk *)0x0;
        }
        else {
          p_c = (chunk *)0x0;
          if ((chunk *)cave == c) {
            p_c = (chunk *)p->cave;
          }
        }
        object_pile_free(c,p_c,obj_00);
      }
      pmVar2 = __s->original_race;
      if (pmVar2 == (monster_race *)0x0) {
        pmVar2 = __s->race;
      }
      pmVar2->cur_num = pmVar2->cur_num + L'\xffffffff';
      grid.x = (__s->grid).x;
      grid.y = (__s->grid).y;
      square_set_mon((chunk_conflict *)c,grid,L'\0');
      memset(__s,0,0x1a0);
    }
  }
  paVar3 = z_info;
  for (uVar4 = 1; uVar4 < paVar3->level_monster_max; uVar4 = uVar4 + 1) {
    if (c->monster_groups[uVar4] != (monster_group *)0x0) {
      monster_group_free((chunk_conflict *)c,c->monster_groups[uVar4]);
      paVar3 = z_info;
    }
  }
  c->mon_max = 1;
  c->mon_cnt = 0;
  c->num_repro = L'\0';
  target_set_monster((monster *)0x0);
  health_track(p->upkeep,(monster *)0x0);
  return;
}

Assistant:

void wipe_mon_list(struct chunk *c, struct player *p)
{
	int m_idx, i;

	/* Delete all the monsters */
	for (m_idx = cave_monster_max(c) - 1; m_idx >= 1; m_idx--) {
		struct monster *mon = cave_monster(c, m_idx);
		struct object *held_obj = mon ? mon->held_obj : NULL;

		/* Skip dead monsters */
		if (!mon->race) continue;

		/* Delete all the objects */
		if (held_obj) {
			/* Go through all held objects and check for artifacts */
			struct object *obj = held_obj;
			while (obj) {
				if (obj->artifact && !obj_is_known_artifact(obj)) {
					mark_artifact_created(obj->artifact,
						false);
				}
				/*
				 * Also, remove from the cave's object list.
				 * That way, the scan for orphaned objects
				 * in cave_free() doesn't attempt to
				 * access freed memory or free memory
				 * twice.
				 */
				if (obj->oidx) {
					c->objects[obj->oidx] = NULL;
				}
				obj = obj->next;
			}
			object_pile_free(c, (p && c == cave) ? p->cave : NULL,
				held_obj);
		}

		/* Reduce the racial counter */
		if (mon->original_race) mon->original_race->cur_num--;
		else mon->race->cur_num--;

		/* Monster is gone from square */
		square_set_mon(c, mon->grid, 0);

		/* Wipe the Monster */
		memset(mon, 0, sizeof(struct monster));
	}

	/* Delete all the monster groups */
	for (i = 1; i < z_info->level_monster_max; i++) {
		if (c->monster_groups[i]) {
			monster_group_free(c, c->monster_groups[i]);
		}
	}

	/* Reset "cave->mon_max" */
	c->mon_max = 1;

	/* Reset "mon_cnt" */
	c->mon_cnt = 0;

	/* Reset "reproducer" count */
	c->num_repro = 0;

	/* Hack -- no more target */
	target_set_monster(0);

	/* Hack -- no more tracking */
	health_track(p->upkeep, 0);
}